

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testMoveRowBefore(tst_RoleMaskProxyModel *this)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  ModelTest *this_00;
  QModelIndex local_c78;
  QModelIndex local_c60;
  QVariant local_c48;
  QModelIndex local_c28;
  QModelIndex local_c10;
  QVariant local_bf8;
  QModelIndex local_bd8;
  QModelIndex local_bc0;
  QVariant local_ba8;
  QModelIndex local_b88;
  QModelIndex local_b70;
  QVariant local_b58;
  QModelIndex local_b38;
  QModelIndex local_b20;
  QVariant local_b08;
  QModelIndex local_ae8;
  QModelIndex local_ad0;
  QVariant local_ab8;
  QModelIndex local_a98;
  QModelIndex local_a80;
  QVariant local_a68;
  QModelIndex local_a48;
  QModelIndex local_a30;
  QVariant local_a18;
  QModelIndex local_9f8;
  QModelIndex local_9e0;
  QVariant local_9c8;
  QModelIndex local_9a8;
  QModelIndex local_990;
  QVariant local_978;
  QModelIndex local_958;
  QModelIndex local_940;
  QModelIndex local_928;
  QModelIndex local_910;
  QVariant local_8f8;
  QModelIndex local_8d8;
  QModelIndex local_8c0;
  QVariant local_8a8;
  QModelIndex local_888;
  QModelIndex local_870;
  QVariant local_858;
  QModelIndex local_838;
  QModelIndex local_820;
  QVariant local_808;
  QModelIndex local_7e8;
  QModelIndex local_7d0;
  QVariant local_7b8;
  QModelIndex local_798;
  QModelIndex local_780;
  QVariant local_768;
  QModelIndex local_748;
  QModelIndex local_730;
  QVariant local_718;
  QModelIndex local_6f8;
  QModelIndex local_6e0;
  QVariant local_6c8;
  QModelIndex local_6a8;
  QModelIndex local_690;
  QVariant local_678;
  QModelIndex local_658;
  QModelIndex local_640;
  QVariant local_628;
  QModelIndex local_608;
  QModelIndex local_5f0;
  QModelIndex local_5d8;
  QModelIndex local_5c0;
  QVariant local_5a8;
  QModelIndex local_588;
  QModelIndex local_570;
  QVariant local_558;
  QModelIndex local_538;
  QModelIndex local_520;
  QVariant local_508;
  QModelIndex local_4e8;
  QModelIndex local_4d0;
  QVariant local_4b8;
  QModelIndex local_498;
  QModelIndex local_480;
  QVariant local_468;
  QModelIndex local_448;
  QModelIndex local_430;
  QVariant local_418;
  QModelIndex local_3f8;
  QModelIndex local_3e0;
  QVariant local_3c8;
  QModelIndex local_3a8;
  QModelIndex local_390;
  QVariant local_378;
  QModelIndex local_358;
  QModelIndex local_340;
  QVariant local_328;
  QModelIndex local_308;
  QModelIndex local_2f0;
  QVariant local_2d8;
  QModelIndex local_2b8;
  QModelIndex local_2a0;
  QVariant local_288;
  QModelIndex local_268;
  QModelIndex local_250;
  QVariant local_238;
  QModelIndex local_218;
  undefined1 local_200 [48];
  uint local_1d0;
  undefined4 local_1cc;
  int i_1;
  QModelIndex local_1a8;
  undefined1 local_190 [52];
  uint local_15c;
  int i;
  QModelIndex local_140;
  QPersistentModelIndex local_128 [8];
  QPersistentModelIndex proxyParentIdx;
  RoleMaskProxyModel proxyModel;
  QModelIndex local_108;
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_c0;
  QModelIndex local_a8;
  QPersistentModelIndex local_90 [8];
  QPersistentModelIndex parentIdx;
  QModelIndex local_70;
  QModelIndex local_48;
  undefined1 local_30 [8];
  GenericModel baseModel;
  anon_class_1_0_00000001 local_11;
  tst_RoleMaskProxyModel *ptStack_10;
  anon_class_1_0_00000001 fillData;
  tst_RoleMaskProxyModel *this_local;
  
  ptStack_10 = this;
  GenericModel::GenericModel((GenericModel *)local_30,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_48);
  GenericModel::insertColumns((int)(GenericModel *)local_30,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex(&local_70);
  GenericModel::insertRows((int)local_30,0,(QModelIndex *)0x5);
  QModelIndex::QModelIndex((QModelIndex *)&parentIdx);
  testMoveRowBefore::anon_class_1_0_00000001::operator()
            (&local_11,(QAbstractItemModel *)local_30,(QModelIndex *)&parentIdx,0);
  QModelIndex::QModelIndex(&local_c0);
  GenericModel::index((int)&local_a8,(int)local_30,(QModelIndex *)0x1);
  QPersistentModelIndex::QPersistentModelIndex(local_90,&local_a8);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_d8,local_90);
  GenericModel::insertColumns((int)local_30,0,(QModelIndex *)0x2);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_f0,local_90);
  GenericModel::insertRows((int)local_30,0,(QModelIndex *)0x5);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_108,local_90);
  testMoveRowBefore::anon_class_1_0_00000001::operator()
            (&local_11,(QAbstractItemModel *)local_30,&local_108,0x32);
  RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&proxyParentIdx,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyParentIdx,(QObject *)local_30);
  RoleMaskProxyModel::addMaskedRole((int)&proxyParentIdx);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyParentIdx);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&stack0xfffffffffffffea8,local_90);
  QIdentityProxyModel::mapFromSource(&local_140);
  QPersistentModelIndex::QPersistentModelIndex(local_128,&local_140);
  local_15c = 0;
  while( true ) {
    uVar1 = local_15c;
    QModelIndex::QModelIndex((QModelIndex *)(local_190 + 0x18));
    iVar4 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyParentIdx);
    uVar2 = local_15c;
    if (iVar4 <= (int)uVar1) break;
    QModelIndex::QModelIndex(&local_1a8);
    QIdentityProxyModel::index((int)local_190,(int)&proxyParentIdx,(QModelIndex *)(ulong)uVar2);
    QVariant::QVariant((QVariant *)&i_1,local_15c + 1000);
    bVar3 = RoleMaskProxyModel::setData
                      ((QModelIndex *)&proxyParentIdx,(QVariant *)local_190,(int)&i_1);
    bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                           "proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0xfe);
    QVariant::~QVariant((QVariant *)&i_1);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      local_1cc = 1;
      goto LAB_0011151c;
    }
    local_15c = local_15c + 1;
  }
  local_1d0 = 0;
  do {
    uVar1 = local_1d0;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)(local_200 + 0x18),local_128)
    ;
    iVar4 = QIdentityProxyModel::rowCount((QModelIndex *)&proxyParentIdx);
    uVar2 = local_1d0;
    if (iVar4 <= (int)uVar1) {
      QModelIndex::QModelIndex(&local_250);
      QModelIndex::QModelIndex(&local_268);
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)local_30,(int)&local_250,4,(QModelIndex *)0x1,
                         (int)&local_268);
      bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                             "baseModel.moveRows(QModelIndex(), 4, 1, QModelIndex(), 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x101);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        QModelIndex::QModelIndex(&local_2b8);
        QIdentityProxyModel::index((int)&local_2a0,(int)&proxyParentIdx,(QModelIndex *)0x0);
        QModelIndex::data(&local_288,&local_2a0,0x100);
        iVar4 = QVariant::toInt((bool *)&local_288);
        bVar3 = QTest::qCompare(iVar4,1000,"proxyModel.index(0, 0).data(Qt::UserRole).toInt()",
                                "1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x102);
        QVariant::~QVariant(&local_288);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_308);
          QIdentityProxyModel::index((int)&local_2f0,(int)&proxyParentIdx,(QModelIndex *)0x1);
          QModelIndex::data(&local_2d8,&local_2f0,0x100);
          iVar4 = QVariant::toInt((bool *)&local_2d8);
          bVar3 = QTest::qCompare(iVar4,0x3ec,"proxyModel.index(1, 0).data(Qt::UserRole).toInt()",
                                  "1004",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x103);
          QVariant::~QVariant(&local_2d8);
          if (((bVar3 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_358);
            QIdentityProxyModel::index((int)&local_340,(int)&proxyParentIdx,(QModelIndex *)0x2);
            QModelIndex::data(&local_328,&local_340,0x100);
            iVar4 = QVariant::toInt((bool *)&local_328);
            bVar3 = QTest::qCompare(iVar4,0x3e9,"proxyModel.index(2, 0).data(Qt::UserRole).toInt()",
                                    "1001",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0x104);
            QVariant::~QVariant(&local_328);
            if (((bVar3 ^ 0xff) & 1) == 0) {
              QModelIndex::QModelIndex(&local_3a8);
              QIdentityProxyModel::index((int)&local_390,(int)&proxyParentIdx,(QModelIndex *)0x3);
              QModelIndex::data(&local_378,&local_390,0x100);
              iVar4 = QVariant::toInt((bool *)&local_378);
              bVar3 = QTest::qCompare(iVar4,0x3ea,
                                      "proxyModel.index(3, 0).data(Qt::UserRole).toInt()","1002",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x105);
              QVariant::~QVariant(&local_378);
              if (((bVar3 ^ 0xff) & 1) == 0) {
                QModelIndex::QModelIndex(&local_3f8);
                QIdentityProxyModel::index((int)&local_3e0,(int)&proxyParentIdx,(QModelIndex *)0x4);
                QModelIndex::data(&local_3c8,&local_3e0,0x100);
                iVar4 = QVariant::toInt((bool *)&local_3c8);
                bVar3 = QTest::qCompare(iVar4,0x3eb,
                                        "proxyModel.index(4, 0).data(Qt::UserRole).toInt()","1003",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x106);
                QVariant::~QVariant(&local_3c8);
                if (((bVar3 ^ 0xff) & 1) == 0) {
                  QPersistentModelIndex::data((int)&local_418);
                  iVar4 = QVariant::toInt((bool *)&local_418);
                  bVar3 = QTest::qCompare(iVar4,0x3e9,"proxyParentIdx.data(Qt::UserRole).toInt()",
                                          "1001",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0x107);
                  QVariant::~QVariant(&local_418);
                  if (((bVar3 ^ 0xff) & 1) == 0) {
                    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_430,local_90);
                    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_448,local_90);
                    bVar3 = GenericModel::moveRows
                                      ((QModelIndex *)local_30,(int)&local_430,4,(QModelIndex *)0x1,
                                       (int)&local_448);
                    bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                                           "baseModel.moveRows(parentIdx, 4, 1, parentIdx, 0)","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                           ,0x108);
                    if (((bVar3 ^ 0xff) & 1) == 0) {
                      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_498,local_128);
                      QIdentityProxyModel::index
                                ((int)&local_480,(int)&proxyParentIdx,(QModelIndex *)0x0);
                      QModelIndex::data(&local_468,&local_480,0x100);
                      iVar4 = QVariant::toInt((bool *)&local_468);
                      bVar3 = QTest::qCompare(iVar4,0x7d4,
                                              "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                              ,"2004",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,0x109);
                      QVariant::~QVariant(&local_468);
                      if (((bVar3 ^ 0xff) & 1) == 0) {
                        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_4e8,local_128);
                        QIdentityProxyModel::index
                                  ((int)&local_4d0,(int)&proxyParentIdx,(QModelIndex *)0x1);
                        QModelIndex::data(&local_4b8,&local_4d0,0x100);
                        iVar4 = QVariant::toInt((bool *)&local_4b8);
                        bVar3 = QTest::qCompare(iVar4,2000,
                                                "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                ,"2000",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x10a);
                        QVariant::~QVariant(&local_4b8);
                        if (((bVar3 ^ 0xff) & 1) == 0) {
                          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_538,local_128);
                          QIdentityProxyModel::index
                                    ((int)&local_520,(int)&proxyParentIdx,(QModelIndex *)0x2);
                          QModelIndex::data(&local_508,&local_520,0x100);
                          iVar4 = QVariant::toInt((bool *)&local_508);
                          bVar3 = QTest::qCompare(iVar4,0x7d1,
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10b);
                          QVariant::~QVariant(&local_508);
                          if (((bVar3 ^ 0xff) & 1) == 0) {
                            QPersistentModelIndex::operator_cast_to_QModelIndex
                                      (&local_588,local_128);
                            QIdentityProxyModel::index
                                      ((int)&local_570,(int)&proxyParentIdx,(QModelIndex *)0x3);
                            QModelIndex::data(&local_558,&local_570,0x100);
                            iVar4 = QVariant::toInt((bool *)&local_558);
                            bVar3 = QTest::qCompare(iVar4,0x7d2,
                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10c);
                            QVariant::~QVariant(&local_558);
                            if (((bVar3 ^ 0xff) & 1) == 0) {
                              QPersistentModelIndex::operator_cast_to_QModelIndex
                                        (&local_5d8,local_128);
                              QIdentityProxyModel::index
                                        ((int)&local_5c0,(int)&proxyParentIdx,(QModelIndex *)0x4);
                              QModelIndex::data(&local_5a8,&local_5c0,0x100);
                              iVar4 = QVariant::toInt((bool *)&local_5a8);
                              bVar3 = QTest::qCompare(iVar4,0x7d3,
                                                                                                            
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10d);
                              QVariant::~QVariant(&local_5a8);
                              if (((bVar3 ^ 0xff) & 1) == 0) {
                                QPersistentModelIndex::operator_cast_to_QModelIndex
                                          (&local_5f0,local_90);
                                QModelIndex::QModelIndex(&local_608);
                                bVar3 = GenericModel::moveRows
                                                  ((QModelIndex *)local_30,(int)&local_5f0,3,
                                                   (QModelIndex *)0x1,(int)&local_608);
                                bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                                                                                                              
                                                  "baseModel.moveRows(parentIdx, 3, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10e);
                                if (((bVar3 ^ 0xff) & 1) == 0) {
                                  QPersistentModelIndex::operator_cast_to_QModelIndex
                                            (&local_658,local_128);
                                  QIdentityProxyModel::index
                                            ((int)&local_640,(int)&proxyParentIdx,(QModelIndex *)0x0
                                            );
                                  QModelIndex::data(&local_628,&local_640,0x100);
                                  iVar4 = QVariant::toInt((bool *)&local_628);
                                  bVar3 = QTest::qCompare(iVar4,0x7d4,
                                                                                                                    
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x10f);
                                  QVariant::~QVariant(&local_628);
                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                    QPersistentModelIndex::operator_cast_to_QModelIndex
                                              (&local_6a8,local_128);
                                    QIdentityProxyModel::index
                                              ((int)&local_690,(int)&proxyParentIdx,
                                               (QModelIndex *)0x1);
                                    QModelIndex::data(&local_678,&local_690,0x100);
                                    iVar4 = QVariant::toInt((bool *)&local_678);
                                    bVar3 = QTest::qCompare(iVar4,2000,
                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x110);
                                    QVariant::~QVariant(&local_678);
                                    if (((bVar3 ^ 0xff) & 1) == 0) {
                                      QPersistentModelIndex::operator_cast_to_QModelIndex
                                                (&local_6f8,local_128);
                                      QIdentityProxyModel::index
                                                ((int)&local_6e0,(int)&proxyParentIdx,
                                                 (QModelIndex *)0x2);
                                      QModelIndex::data(&local_6c8,&local_6e0,0x100);
                                      iVar4 = QVariant::toInt((bool *)&local_6c8);
                                      bVar3 = QTest::qCompare(iVar4,0x7d1,
                                                                                                                            
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x111);
                                      QVariant::~QVariant(&local_6c8);
                                      if (((bVar3 ^ 0xff) & 1) == 0) {
                                        QPersistentModelIndex::operator_cast_to_QModelIndex
                                                  (&local_748,local_128);
                                        QIdentityProxyModel::index
                                                  ((int)&local_730,(int)&proxyParentIdx,
                                                   (QModelIndex *)0x3);
                                        QModelIndex::data(&local_718,&local_730,0x100);
                                        iVar4 = QVariant::toInt((bool *)&local_718);
                                        bVar3 = QTest::qCompare(iVar4,0x7d3,
                                                                                                                                
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x112);
                                        QVariant::~QVariant(&local_718);
                                        if (((bVar3 ^ 0xff) & 1) == 0) {
                                          QModelIndex::QModelIndex(&local_798);
                                          QIdentityProxyModel::index
                                                    ((int)&local_780,(int)&proxyParentIdx,
                                                     (QModelIndex *)0x0);
                                          QModelIndex::data(&local_768,&local_780,0x100);
                                          iVar4 = QVariant::toInt((bool *)&local_768);
                                          bVar3 = QTest::qCompare(iVar4,0x7d2,
                                                                                                                                    
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x113);
                                          QVariant::~QVariant(&local_768);
                                          if (((bVar3 ^ 0xff) & 1) == 0) {
                                            QModelIndex::QModelIndex(&local_7e8);
                                            QIdentityProxyModel::index
                                                      ((int)&local_7d0,(int)&proxyParentIdx,
                                                       (QModelIndex *)0x1);
                                            QModelIndex::data(&local_7b8,&local_7d0,0x100);
                                            iVar4 = QVariant::toInt((bool *)&local_7b8);
                                            bVar3 = QTest::qCompare(iVar4,1000,
                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x114);
                                            QVariant::~QVariant(&local_7b8);
                                            if (((bVar3 ^ 0xff) & 1) == 0) {
                                              QModelIndex::QModelIndex(&local_838);
                                              QIdentityProxyModel::index
                                                        ((int)&local_820,(int)&proxyParentIdx,
                                                         (QModelIndex *)0x2);
                                              QModelIndex::data(&local_808,&local_820,0x100);
                                              iVar4 = QVariant::toInt((bool *)&local_808);
                                              bVar3 = QTest::qCompare(iVar4,0x3ec,
                                                                                                                                            
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x115);
                                              QVariant::~QVariant(&local_808);
                                              if (((bVar3 ^ 0xff) & 1) == 0) {
                                                QModelIndex::QModelIndex(&local_888);
                                                QIdentityProxyModel::index
                                                          ((int)&local_870,(int)&proxyParentIdx,
                                                           (QModelIndex *)0x3);
                                                QModelIndex::data(&local_858,&local_870,0x100);
                                                iVar4 = QVariant::toInt((bool *)&local_858);
                                                bVar3 = QTest::qCompare(iVar4,0x3e9,
                                                                                                                                                
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x116);
                                                QVariant::~QVariant(&local_858);
                                                if (((bVar3 ^ 0xff) & 1) == 0) {
                                                  QModelIndex::QModelIndex(&local_8d8);
                                                  QIdentityProxyModel::index
                                                            ((int)&local_8c0,(int)&proxyParentIdx,
                                                             (QModelIndex *)0x4);
                                                  QModelIndex::data(&local_8a8,&local_8c0,0x100);
                                                  iVar4 = QVariant::toInt((bool *)&local_8a8);
                                                  bVar3 = QTest::qCompare(iVar4,0x3ea,
                                                                                                                                                    
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x117);
                                                  QVariant::~QVariant(&local_8a8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_928);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_910,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x5);
                                                    QModelIndex::data(&local_8f8,&local_910,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_8f8);
                                                    bVar3 = QTest::qCompare(iVar4,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(5, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x118);
                                                  QVariant::~QVariant(&local_8f8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_940);
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_958,local_90);
                                                    bVar3 = GenericModel::moveRows
                                                                      ((QModelIndex *)local_30,
                                                                       (int)&local_940,4,
                                                                       (QModelIndex *)0x1,
                                                                       (int)&local_958);
                                                    bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                                                                                                                                                      
                                                  "baseModel.moveRows(QModelIndex(), 4, 1, parentIdx, 1)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x119);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_9a8);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_990,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_978,&local_990,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_978);
                                                    bVar3 = QTest::qCompare(iVar4,0x7d2,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0).data(Qt::UserRole).toInt()"
                                                  ,"2002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11a);
                                                  QVariant::~QVariant(&local_978);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_9f8);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_9e0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_9c8,&local_9e0,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_9c8);
                                                    bVar3 = QTest::qCompare(iVar4,1000,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0).data(Qt::UserRole).toInt()"
                                                  ,"1000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11b);
                                                  QVariant::~QVariant(&local_9c8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a48);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a30,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_a18,&local_a30,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_a18);
                                                    bVar3 = QTest::qCompare(iVar4,0x3ec,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0).data(Qt::UserRole).toInt()"
                                                  ,"1004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11c);
                                                  QVariant::~QVariant(&local_a18);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_a98);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_a80,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_a68,&local_a80,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_a68);
                                                    bVar3 = QTest::qCompare(iVar4,0x3e9,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0).data(Qt::UserRole).toInt()"
                                                  ,"1001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11d);
                                                  QVariant::~QVariant(&local_a68);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QModelIndex::QModelIndex(&local_ae8);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_ad0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_ab8,&local_ad0,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_ab8);
                                                    bVar3 = QTest::qCompare(iVar4,0x3eb,
                                                                                                                                                        
                                                  "proxyModel.index(4, 0).data(Qt::UserRole).toInt()"
                                                  ,"1003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11e);
                                                  QVariant::~QVariant(&local_ab8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_b38,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_b20,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x0);
                                                    QModelIndex::data(&local_b08,&local_b20,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_b08);
                                                    bVar3 = QTest::qCompare(iVar4,0x7d4,
                                                                                                                                                        
                                                  "proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2004",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x11f);
                                                  QVariant::~QVariant(&local_b08);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_b88,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_b70,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x1);
                                                    QModelIndex::data(&local_b58,&local_b70,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_b58);
                                                    bVar3 = QTest::qCompare(iVar4,0x3ea,
                                                                                                                                                        
                                                  "proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"1002",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x120);
                                                  QVariant::~QVariant(&local_b58);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_bd8,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_bc0,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x2);
                                                    QModelIndex::data(&local_ba8,&local_bc0,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_ba8);
                                                    bVar3 = QTest::qCompare(iVar4,2000,
                                                                                                                                                        
                                                  "proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2000",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x121);
                                                  QVariant::~QVariant(&local_ba8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_c28,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_c10,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x3);
                                                    QModelIndex::data(&local_bf8,&local_c10,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_bf8);
                                                    bVar3 = QTest::qCompare(iVar4,0x7d1,
                                                                                                                                                        
                                                  "proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2001",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x122);
                                                  QVariant::~QVariant(&local_bf8);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    QPersistentModelIndex::
                                                    operator_cast_to_QModelIndex
                                                              (&local_c78,local_128);
                                                    QIdentityProxyModel::index
                                                              ((int)&local_c60,(int)&proxyParentIdx,
                                                               (QModelIndex *)0x4);
                                                    QModelIndex::data(&local_c48,&local_c60,0x100);
                                                    iVar4 = QVariant::toInt((bool *)&local_c48);
                                                    bVar3 = QTest::qCompare(iVar4,0x7d3,
                                                                                                                                                        
                                                  "proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt()"
                                                  ,"2003",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x123);
                                                  QVariant::~QVariant(&local_c48);
                                                  if (((bVar3 ^ 0xff) & 1) == 0) {
                                                    local_1cc = 0;
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                  }
                                                  else {
                                                    local_1cc = 1;
                                                  }
                                                }
                                                else {
                                                  local_1cc = 1;
                                                }
                                              }
                                              else {
                                                local_1cc = 1;
                                              }
                                            }
                                            else {
                                              local_1cc = 1;
                                            }
                                          }
                                          else {
                                            local_1cc = 1;
                                          }
                                        }
                                        else {
                                          local_1cc = 1;
                                        }
                                      }
                                      else {
                                        local_1cc = 1;
                                      }
                                    }
                                    else {
                                      local_1cc = 1;
                                    }
                                  }
                                  else {
                                    local_1cc = 1;
                                  }
                                }
                                else {
                                  local_1cc = 1;
                                }
                              }
                              else {
                                local_1cc = 1;
                              }
                            }
                            else {
                              local_1cc = 1;
                            }
                          }
                          else {
                            local_1cc = 1;
                          }
                        }
                        else {
                          local_1cc = 1;
                        }
                      }
                      else {
                        local_1cc = 1;
                      }
                    }
                    else {
                      local_1cc = 1;
                    }
                  }
                  else {
                    local_1cc = 1;
                  }
                }
                else {
                  local_1cc = 1;
                }
              }
              else {
                local_1cc = 1;
              }
            }
            else {
              local_1cc = 1;
            }
          }
          else {
            local_1cc = 1;
          }
        }
        else {
          local_1cc = 1;
        }
      }
      else {
        local_1cc = 1;
      }
LAB_0011151c:
      QPersistentModelIndex::~QPersistentModelIndex(local_128);
      RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&proxyParentIdx);
      QPersistentModelIndex::~QPersistentModelIndex(local_90);
      GenericModel::~GenericModel((GenericModel *)local_30);
      return;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_218,local_128);
    QIdentityProxyModel::index((int)local_200,(int)&proxyParentIdx,(QModelIndex *)(ulong)uVar2);
    QVariant::QVariant(&local_238,local_1d0 + 2000);
    bVar3 = RoleMaskProxyModel::setData
                      ((QModelIndex *)&proxyParentIdx,(QVariant *)local_200,(int)&local_238);
    bVar3 = QTest::qVerify((bool)(bVar3 & 1),
                           "proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole)"
                           ,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x100);
    QVariant::~QVariant(&local_238);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      local_1cc = 1;
      goto LAB_0011151c;
    }
    local_1d0 = local_1d0 + 1;
  } while( true );
}

Assistant:

void tst_RoleMaskProxyModel::testMoveRowBefore()
{
#ifdef QTMODELUTILITIES_GENERICMODEL
    const auto fillData = [](QAbstractItemModel *model, const QModelIndex &parent = QModelIndex(), int shift = 0) {
        for (int i = 0, maxI = model->rowCount(parent); i < maxI; ++i) {
            for (int j = 0, maxJ = model->columnCount(parent); j < maxJ; ++j) {
                model->setData(model->index(i, j, parent), i + shift, Qt::UserRole);
                model->setData(model->index(i, j, parent), j + shift, Qt::UserRole + 1);
            }
        }
    };
    GenericModel baseModel;
    baseModel.insertColumns(0, 2);
    baseModel.insertRows(0, 5);
    fillData(&baseModel);
    const QPersistentModelIndex parentIdx = baseModel.index(1, 0);
    baseModel.insertColumns(0, 2, parentIdx);
    baseModel.insertRows(0, 5, parentIdx);
    fillData(&baseModel, parentIdx, 50);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, &baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(&baseModel);
    const QPersistentModelIndex proxyParentIdx = proxyModel.mapFromSource(parentIdx);
    for (int i = 0; i < proxyModel.rowCount(); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), 1000 + i, Qt::UserRole));
    for (int i = 0; i < proxyModel.rowCount(proxyParentIdx); ++i)
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0, proxyParentIdx), 2000 + i, Qt::UserRole));
    QVERIFY(baseModel.moveRows(QModelIndex(), 4, 1, QModelIndex(), 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyParentIdx.data(Qt::UserRole).toInt(), 1001);
    QVERIFY(baseModel.moveRows(parentIdx, 4, 1, parentIdx, 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QVERIFY(baseModel.moveRows(parentIdx, 3, 1, QModelIndex(), 0));
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(5, 0).data(Qt::UserRole).toInt(), 1003);
    QVERIFY(baseModel.moveRows(QModelIndex(), 4, 1, parentIdx, 1));
    QCOMPARE(proxyModel.index(0, 0).data(Qt::UserRole).toInt(), 2002);
    QCOMPARE(proxyModel.index(1, 0).data(Qt::UserRole).toInt(), 1000);
    QCOMPARE(proxyModel.index(2, 0).data(Qt::UserRole).toInt(), 1004);
    QCOMPARE(proxyModel.index(3, 0).data(Qt::UserRole).toInt(), 1001);
    QCOMPARE(proxyModel.index(4, 0).data(Qt::UserRole).toInt(), 1003);
    QCOMPARE(proxyModel.index(0, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2004);
    QCOMPARE(proxyModel.index(1, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 1002);
    QCOMPARE(proxyModel.index(2, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2000);
    QCOMPARE(proxyModel.index(3, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2001);
    QCOMPARE(proxyModel.index(4, 0, proxyParentIdx).data(Qt::UserRole).toInt(), 2003);
#else
    QSKIP("This test requires the GenericModel module");
#endif
}